

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O1

bool __thiscall
cmFileCommand::HandleGetRuntimeDependenciesCommand
          (cmFileCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  _Base_ptr *pp_Var1;
  _Base_ptr __x;
  cmMakefile *pcVar2;
  pointer pcVar3;
  pointer pbVar4;
  bool bVar5;
  Mode MVar6;
  int iVar7;
  string *psVar8;
  const_iterator cVar9;
  cmState *this_00;
  ostream *poVar10;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  *pmVar11;
  _Base_ptr p_Var12;
  long *plVar13;
  _Base_ptr p_Var14;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar15;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar16;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __begin0;
  pointer pbVar17;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __end0;
  _Rb_tree_header *p_Var18;
  long lVar19;
  string_view arg;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  static_string_view name;
  static_string_view name_00;
  static_string_view name_01;
  static_string_view name_02;
  static_string_view name_03;
  static_string_view name_04;
  static_string_view name_05;
  static_string_view name_06;
  static_string_view name_07;
  static_string_view name_08;
  static_string_view name_09;
  static_string_view name_10;
  string pathsStr;
  string platform;
  ostringstream e;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_518;
  undefined1 *local_508 [2];
  undefined1 local_4f8 [16];
  long *local_4e8 [2];
  long local_4d8 [4];
  ios_base local_4b8 [272];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unresolvedDeps;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  keywordsMissingValues;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unrecognizedArguments;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  paths;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  conflictingDeps;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  deps;
  string local_2e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2c8;
  Arguments parsedArgs;
  cmRuntimeDependencyArchive archive;
  
  if (HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
      ::supportedPlatforms_abi_cxx11_ == '\0') {
    iVar7 = __cxa_guard_acquire(&HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                                 ::supportedPlatforms_abi_cxx11_);
    if (iVar7 != 0) {
      _e = (cmArgumentParser<Arguments> *)&aStack_518;
      std::__cxx11::string::_M_construct<char_const*>((string *)&e,"Windows","");
      local_508[0] = local_4f8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_508,"Linux","");
      plVar13 = local_4d8;
      local_4e8[0] = plVar13;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_4e8,"Darwin","");
      __l._M_len = 3;
      __l._M_array = (iterator)&e;
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::set(&HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
             ::supportedPlatforms_abi_cxx11_,__l,
            (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&parsedArgs,(allocator_type *)&archive);
      lVar19 = -0x60;
      do {
        if (plVar13 != (long *)plVar13[-2]) {
          operator_delete((long *)plVar13[-2],*plVar13 + 1);
        }
        plVar13 = plVar13 + -4;
        lVar19 = lVar19 + 0x20;
      } while (lVar19 != 0);
      __cxa_atexit(std::
                   set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::~set,&HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                           ::supportedPlatforms_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                           ::supportedPlatforms_abi_cxx11_);
    }
  }
  pcVar2 = (this->super_cmCommand).Makefile;
  _e = (cmArgumentParser<Arguments> *)&aStack_518;
  std::__cxx11::string::_M_construct<char_const*>((string *)&e,"CMAKE_HOST_SYSTEM_NAME","");
  psVar8 = cmMakefile::GetSafeDefinition(pcVar2,(string *)&e);
  platform._M_dataplus._M_p = (pointer)&platform.field_2;
  pcVar3 = (psVar8->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&platform,pcVar3,pcVar3 + psVar8->_M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_e != &aStack_518) {
    operator_delete(_e,aStack_518._M_allocated_capacity + 1);
  }
  cVar9 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find(&HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                  ::supportedPlatforms_abi_cxx11_._M_t,&platform);
  if ((_Rb_tree_header *)cVar9._M_node ==
      &HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
       ::supportedPlatforms_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&e,"GET_RUNTIME_DEPENDENCIES is not supported on system \"",0x35);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&e,platform._M_dataplus._M_p,platform._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\"",1);
    std::__cxx11::stringbuf::str();
    cmCommand::SetError(&this->super_cmCommand,&parsedArgs.ResolvedDependenciesVar);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)parsedArgs.ResolvedDependenciesVar._M_dataplus._M_p !=
        &parsedArgs.ResolvedDependenciesVar.field_2) {
      operator_delete(parsedArgs.ResolvedDependenciesVar._M_dataplus._M_p,
                      CONCAT71(parsedArgs.ResolvedDependenciesVar.field_2._M_allocated_capacity.
                               _1_7_,parsedArgs.ResolvedDependenciesVar.field_2._M_local_buf[0]) + 1
                     );
    }
    cmSystemTools::s_FatalErrorOccured = true;
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
    std::ios_base::~ios_base(local_4b8);
    bVar5 = false;
    goto LAB_0019a5ef;
  }
  this_00 = cmMakefile::GetState((this->super_cmCommand).Makefile);
  MVar6 = cmState::GetMode(this_00);
  if (MVar6 == Project) {
    pcVar2 = (this->super_cmCommand).Makefile;
    _e = (cmArgumentParser<Arguments> *)&aStack_518;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&e,
               "You have used file(GET_RUNTIME_DEPENDENCIES) in project mode. This is probably not what you intended to do. Instead, please consider using it in an install(CODE) or install(SCRIPT) command. For example:\n  install(CODE [[\n    file(GET_RUNTIME_DEPENDENCIES\n      # ...\n      )\n    ]])"
               ,"");
    cmMakefile::IssueMessage(pcVar2,AUTHOR_WARNING,(string *)&e);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_e != &aStack_518) {
      operator_delete(_e,aStack_518._M_allocated_capacity + 1);
    }
  }
  if (HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
      ::parser == '\0') {
    iVar7 = __cxa_guard_acquire(&HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                                 ::parser);
    if (iVar7 != 0) {
      _e = (cmArgumentParser<Arguments> *)0x0;
      aStack_518._M_allocated_capacity = 0;
      name.super_string_view._M_str = "RESOLVED_DEPENDENCIES_VAR";
      name.super_string_view._M_len = 0x19;
      cmArgumentParser<cmFileCommand::HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::Arguments>
      ::Bind<std::__cxx11::string>
                ((cmArgumentParser<cmFileCommand::HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::Arguments>
                  *)&e,name,0);
      name_00.super_string_view._M_str = "UNRESOLVED_DEPENDENCIES_VAR";
      name_00.super_string_view._M_len = 0x1b;
      cmArgumentParser<cmFileCommand::HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::Arguments>
      ::Bind<std::__cxx11::string>
                ((cmArgumentParser<cmFileCommand::HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::Arguments>
                  *)&e,name_00,0x20);
      name_01.super_string_view._M_str = "CONFLICTING_DEPENDENCIES_PREFIX";
      name_01.super_string_view._M_len = 0x1f;
      cmArgumentParser<cmFileCommand::HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::Arguments>
      ::Bind<std::__cxx11::string>
                ((cmArgumentParser<cmFileCommand::HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::Arguments>
                  *)&e,name_01,0x40);
      name_02.super_string_view._M_str = "BUNDLE_EXECUTABLE";
      name_02.super_string_view._M_len = 0x11;
      cmArgumentParser<cmFileCommand::HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::Arguments>
      ::Bind<std::__cxx11::string>
                ((cmArgumentParser<cmFileCommand::HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::Arguments>
                  *)&e,name_02,0x60);
      name_03.super_string_view._M_str = "EXECUTABLES";
      name_03.super_string_view._M_len = 0xb;
      cmArgumentParser<cmFileCommand::HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::Arguments>
      ::Bind<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                ((cmArgumentParser<cmFileCommand::HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::Arguments>
                  *)&e,name_03,0x80);
      name_04.super_string_view._M_str = "LIBRARIES";
      name_04.super_string_view._M_len = 9;
      cmArgumentParser<cmFileCommand::HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::Arguments>
      ::Bind<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                ((cmArgumentParser<cmFileCommand::HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::Arguments>
                  *)&e,name_04,0x98);
      name_05.super_string_view._M_str = "MODULES";
      name_05.super_string_view._M_len = 7;
      cmArgumentParser<cmFileCommand::HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::Arguments>
      ::Bind<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                ((cmArgumentParser<cmFileCommand::HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::Arguments>
                  *)&e,name_05,200);
      name_06.super_string_view._M_str = "DIRECTORIES";
      name_06.super_string_view._M_len = 0xb;
      cmArgumentParser<cmFileCommand::HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::Arguments>
      ::Bind<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                ((cmArgumentParser<cmFileCommand::HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::Arguments>
                  *)&e,name_06,0xb0);
      name_07.super_string_view._M_str = "PRE_INCLUDE_REGEXES";
      name_07.super_string_view._M_len = 0x13;
      cmArgumentParser<cmFileCommand::HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::Arguments>
      ::Bind<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                ((cmArgumentParser<cmFileCommand::HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::Arguments>
                  *)&e,name_07,0xe0);
      name_08.super_string_view._M_str = "PRE_EXCLUDE_REGEXES";
      name_08.super_string_view._M_len = 0x13;
      cmArgumentParser<cmFileCommand::HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::Arguments>
      ::Bind<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                ((cmArgumentParser<cmFileCommand::HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::Arguments>
                  *)&e,name_08,0xf8);
      name_09.super_string_view._M_str = "POST_INCLUDE_REGEXES";
      name_09.super_string_view._M_len = 0x14;
      cmArgumentParser<cmFileCommand::HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::Arguments>
      ::Bind<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                ((cmArgumentParser<cmFileCommand::HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::Arguments>
                  *)&e,name_09,0x110);
      name_10.super_string_view._M_str = "POST_EXCLUDE_REGEXES";
      name_10.super_string_view._M_len = 0x14;
      cmArgumentParser<cmFileCommand::HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::Arguments>
      ::Bind<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                ((cmArgumentParser<cmFileCommand::HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::Arguments>
                  *)&e,name_10,0x128);
      std::
      vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
      ::vector((vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
                *)&HandleGetRuntimeDependenciesCommand::parser,
               (vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
                *)&e);
      std::
      vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
      ::~vector((vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
                 *)&e);
      __cxa_atexit(cmArgumentParser<Arguments>::~cmArgumentParser,
                   &HandleGetRuntimeDependenciesCommand::parser,&__dso_handle);
      __cxa_guard_release(&HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                           ::parser);
    }
  }
  unrecognizedArguments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  unrecognizedArguments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  unrecognizedArguments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  keywordsMissingValues.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  keywordsMissingValues.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  keywordsMissingValues.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pbVar4 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  pbVar17 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start + 1;
  parsedArgs.ResolvedDependenciesVar._M_dataplus._M_p =
       (pointer)&parsedArgs.ResolvedDependenciesVar.field_2;
  parsedArgs.ResolvedDependenciesVar._M_string_length = 0;
  parsedArgs.ResolvedDependenciesVar.field_2._M_local_buf[0] = '\0';
  parsedArgs.UnresolvedDependenciesVar._M_dataplus._M_p =
       (pointer)&parsedArgs.UnresolvedDependenciesVar.field_2;
  parsedArgs.UnresolvedDependenciesVar._M_string_length = 0;
  parsedArgs.UnresolvedDependenciesVar.field_2._M_local_buf[0] = '\0';
  parsedArgs.ConflictingDependenciesPrefix._M_dataplus._M_p =
       (pointer)&parsedArgs.ConflictingDependenciesPrefix.field_2;
  parsedArgs.ConflictingDependenciesPrefix._M_string_length = 0;
  parsedArgs.ConflictingDependenciesPrefix.field_2._M_local_buf[0] = '\0';
  parsedArgs.BundleExecutable._M_dataplus._M_p = (pointer)&parsedArgs.BundleExecutable.field_2;
  parsedArgs.BundleExecutable._M_string_length = 0;
  parsedArgs.BundleExecutable.field_2._M_local_buf[0] = '\0';
  memset(&parsedArgs.Executables,0,0xc0);
  _e = &HandleGetRuntimeDependenciesCommand::parser;
  aStack_518._M_allocated_capacity = 0;
  aStack_518._8_8_ = aStack_518._8_8_ & 0xffffffffffffff00;
  if (pbVar17 != pbVar4) {
    do {
      arg._M_str = (pbVar17->_M_dataplus)._M_p;
      arg._M_len = pbVar17->_M_string_length;
      ArgumentParser::Instance::Consume
                ((Instance *)&e,arg,&parsedArgs,&unrecognizedArguments,&keywordsMissingValues);
      pbVar17 = pbVar17 + 1;
    } while (pbVar17 != pbVar4);
  }
  pbVar17 = unrecognizedArguments.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pbVar4 = keywordsMissingValues.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (unrecognizedArguments.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      unrecognizedArguments.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    if (keywordsMissingValues.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        keywordsMissingValues.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&e,"Keyword missing value: ",0x17);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&e,(pbVar4->_M_dataplus)._M_p,pbVar4->_M_string_length);
      std::__cxx11::stringbuf::str();
      cmCommand::SetError(&this->super_cmCommand,(string *)&archive);
      goto LAB_0019a57d;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_2c8,&parsedArgs.Directories);
    local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2e8,parsedArgs.BundleExecutable._M_dataplus._M_p,
               parsedArgs.BundleExecutable._M_dataplus._M_p +
               parsedArgs.BundleExecutable._M_string_length);
    cmRuntimeDependencyArchive::cmRuntimeDependencyArchive
              (&archive,&this->super_cmCommand,&local_2c8,&local_2e8,&parsedArgs.PreIncludeRegexes,
               &parsedArgs.PreExcludeRegexes,&parsedArgs.PostIncludeRegexes,
               &parsedArgs.PostExcludeRegexes);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
      operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_2c8);
    bVar5 = cmRuntimeDependencyArchive::Prepare(&archive);
    if (bVar5) {
      bVar5 = cmRuntimeDependencyArchive::GetRuntimeDependencies
                        (&archive,&parsedArgs.Executables,&parsedArgs.Libraries,&parsedArgs.Modules)
      ;
      if (!bVar5) goto LAB_0019aafd;
      deps.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      deps.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      deps.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      unresolvedDeps.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      unresolvedDeps.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      unresolvedDeps.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      conflictingDeps.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      conflictingDeps.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      conflictingDeps.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      pmVar11 = cmRuntimeDependencyArchive::GetResolvedPaths_abi_cxx11_(&archive);
      p_Var14 = (pmVar11->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var18 = &(pmVar11->_M_t)._M_impl.super__Rb_tree_header;
      if ((_Rb_tree_header *)p_Var14 != p_Var18) {
LAB_0019a76b:
        p_Var12 = p_Var14[2]._M_right;
        pp_Var1 = &p_Var14[2]._M_parent;
        if (p_Var12 == (_Base_ptr)pp_Var1) {
          __assert_fail("it != val.second.end()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmFileCommand.cxx"
                        ,0xaf5,
                        "bool cmFileCommand::HandleGetRuntimeDependenciesCommand(const std::vector<std::string> &)"
                       );
        }
        __x = p_Var12 + 1;
        do {
          p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12);
          if (p_Var12 == (_Base_ptr)pp_Var1) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&deps,(value_type *)__x);
            goto LAB_0019a931;
          }
          bVar5 = cmsys::SystemTools::SameFile((string *)__x,(string *)(p_Var12 + 1));
        } while (bVar5);
        if (parsedArgs.ConflictingDependenciesPrefix._M_string_length != 0) goto LAB_0019a7ba;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&e,"Multiple conflicting paths found for ",0x25);
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&e,*(char **)(p_Var14 + 1),(long)p_Var14[1]._M_parent);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,":",1);
        p_Var14 = p_Var14[2]._M_right;
        if (p_Var14 != (_Base_ptr)pp_Var1) {
          do {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&e,"\n  ",3);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&e,*(char **)(p_Var14 + 1),(long)p_Var14[1]._M_parent);
            p_Var14 = (_Base_ptr)std::_Rb_tree_increment(p_Var14);
          } while (p_Var14 != (_Base_ptr)pp_Var1);
        }
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(&this->super_cmCommand,&pathsStr);
        goto LAB_0019ac4a;
      }
LAB_0019a945:
      psVar15 = cmRuntimeDependencyArchive::GetUnresolvedPaths_abi_cxx11_(&archive);
      pbVar4 = unresolvedDeps.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((psVar15->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 0) {
LAB_0019a9a8:
        if (parsedArgs.ResolvedDependenciesVar._M_string_length != 0) {
          cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                    ((string *)&e,&deps,";");
          cmMakefile::AddDefinition
                    ((this->super_cmCommand).Makefile,&parsedArgs.ResolvedDependenciesVar,(char *)_e
                    );
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_e != &aStack_518) {
            operator_delete(_e,aStack_518._M_allocated_capacity + 1);
          }
        }
        if (parsedArgs.UnresolvedDependenciesVar._M_string_length != 0) {
          cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                    ((string *)&e,&unresolvedDeps,";");
          cmMakefile::AddDefinition
                    ((this->super_cmCommand).Makefile,&parsedArgs.UnresolvedDependenciesVar,
                     (char *)_e);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_e != &aStack_518) {
            operator_delete(_e,aStack_518._M_allocated_capacity + 1);
          }
        }
        bVar5 = true;
        if (parsedArgs.ConflictingDependenciesPrefix._M_string_length != 0) {
          cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                    ((string *)&e,&conflictingDeps,";");
          pcVar2 = (this->super_cmCommand).Makefile;
          std::operator+(&pathsStr,&parsedArgs.ConflictingDependenciesPrefix,"_FILENAMES");
          cmMakefile::AddDefinition(pcVar2,&pathsStr,(char *)_e);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pathsStr._M_dataplus._M_p != &pathsStr.field_2) {
            operator_delete(pathsStr._M_dataplus._M_p,pathsStr.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_e != &aStack_518) {
            operator_delete(_e,aStack_518._M_allocated_capacity + 1);
          }
        }
      }
      else {
        if (parsedArgs.UnresolvedDependenciesVar._M_string_length != 0) {
          psVar15 = cmRuntimeDependencyArchive::GetUnresolvedPaths_abi_cxx11_(&archive);
          p_Var14 = (psVar15->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
          psVar15 = cmRuntimeDependencyArchive::GetUnresolvedPaths_abi_cxx11_(&archive);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          _M_range_insert<std::_Rb_tree_const_iterator<std::__cxx11::string>>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &unresolvedDeps,pbVar4,p_Var14,&(psVar15->_M_t)._M_impl.super__Rb_tree_header);
          goto LAB_0019a9a8;
        }
        psVar15 = cmRuntimeDependencyArchive::GetUnresolvedPaths_abi_cxx11_(&archive);
        p_Var14 = (psVar15->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        psVar15 = cmRuntimeDependencyArchive::GetUnresolvedPaths_abi_cxx11_(&archive);
        if ((_Rb_tree_header *)p_Var14 == &(psVar15->_M_t)._M_impl.super__Rb_tree_header) {
          __assert_fail("it != archive.GetUnresolvedPaths().end()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmFileCommand.cxx"
                        ,0xb1a,
                        "bool cmFileCommand::HandleGetRuntimeDependenciesCommand(const std::vector<std::string> &)"
                       );
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&e,"Could not resolve file ",0x17);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&e,*(char **)(p_Var14 + 1),(long)p_Var14[1]._M_parent);
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(&this->super_cmCommand,&pathsStr);
LAB_0019ac4a:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pathsStr._M_dataplus._M_p != &pathsStr.field_2) {
          operator_delete(pathsStr._M_dataplus._M_p,pathsStr.field_2._M_allocated_capacity + 1);
        }
        cmSystemTools::s_FatalErrorOccured = true;
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
        std::ios_base::~ios_base(local_4b8);
        bVar5 = false;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&conflictingDeps);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&unresolvedDeps);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&deps);
    }
    else {
LAB_0019aafd:
      cmSystemTools::s_FatalErrorOccured = true;
      bVar5 = false;
    }
    cmRuntimeDependencyArchive::~cmRuntimeDependencyArchive(&archive);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&e,"Unrecognized argument: \"",0x18);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&e,(pbVar17->_M_dataplus)._M_p,pbVar17->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\"",1);
    std::__cxx11::stringbuf::str();
    cmCommand::SetError(&this->super_cmCommand,(string *)&archive);
LAB_0019a57d:
    if (archive.Command != (cmCommand *)&archive.GetRuntimeDependenciesTool) {
      operator_delete(archive.Command,
                      (ulong)(archive.GetRuntimeDependenciesTool._M_dataplus._M_p + 1));
    }
    cmSystemTools::s_FatalErrorOccured = true;
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
    std::ios_base::~ios_base(local_4b8);
    bVar5 = false;
  }
  HandleGetRuntimeDependenciesCommand::Arguments::~Arguments(&parsedArgs);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&keywordsMissingValues);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&unrecognizedArguments);
LAB_0019a5ef:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)platform._M_dataplus._M_p != &platform.field_2) {
    operator_delete(platform._M_dataplus._M_p,platform.field_2._M_allocated_capacity + 1);
  }
  return bVar5;
LAB_0019a7ba:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&conflictingDeps,(value_type *)(p_Var14 + 1));
  paths.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  paths.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  paths.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_range_insert<std::_Rb_tree_const_iterator<std::__cxx11::string>>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&paths,0,
             p_Var14[2]._M_right,pp_Var1);
  pathsStr._M_dataplus._M_p = (pointer)&pathsStr.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pathsStr,parsedArgs.ConflictingDependenciesPrefix._M_dataplus._M_p,
             parsedArgs.ConflictingDependenciesPrefix._M_dataplus._M_p +
             parsedArgs.ConflictingDependenciesPrefix._M_string_length);
  std::__cxx11::string::append((char *)&pathsStr);
  plVar13 = (long *)std::__cxx11::string::_M_append((char *)&pathsStr,*(ulong *)(p_Var14 + 1));
  _e = (cmArgumentParser<Arguments> *)&aStack_518;
  paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar13 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar13 == paVar16) {
    aStack_518._M_allocated_capacity = paVar16->_M_allocated_capacity;
    aStack_518._8_8_ = plVar13[3];
  }
  else {
    aStack_518._M_allocated_capacity = paVar16->_M_allocated_capacity;
    _e = (cmArgumentParser<Arguments> *)*plVar13;
  }
  *plVar13 = (long)paVar16;
  plVar13[1] = 0;
  *(undefined1 *)(plVar13 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pathsStr._M_dataplus._M_p != &pathsStr.field_2) {
    operator_delete(pathsStr._M_dataplus._M_p,pathsStr.field_2._M_allocated_capacity + 1);
  }
  cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&pathsStr,&paths,";");
  cmMakefile::AddDefinition((this->super_cmCommand).Makefile,(string *)&e,pathsStr._M_dataplus._M_p)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pathsStr._M_dataplus._M_p != &pathsStr.field_2) {
    operator_delete(pathsStr._M_dataplus._M_p,pathsStr.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_e != &aStack_518) {
    operator_delete(_e,aStack_518._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&paths);
LAB_0019a931:
  p_Var14 = (_Base_ptr)std::_Rb_tree_increment(p_Var14);
  if ((_Rb_tree_header *)p_Var14 == p_Var18) goto LAB_0019a945;
  goto LAB_0019a76b;
}

Assistant:

bool cmFileCommand::HandleGetRuntimeDependenciesCommand(
  std::vector<std::string> const& args)
{
  static const std::set<std::string> supportedPlatforms = { "Windows", "Linux",
                                                            "Darwin" };
  std::string platform =
    this->Makefile->GetSafeDefinition("CMAKE_HOST_SYSTEM_NAME");
  if (!supportedPlatforms.count(platform)) {
    std::ostringstream e;
    e << "GET_RUNTIME_DEPENDENCIES is not supported on system \"" << platform
      << "\"";
    this->SetError(e.str());
    cmSystemTools::SetFatalErrorOccured();
    return false;
  }

  if (this->Makefile->GetState()->GetMode() == cmState::Project) {
    this->Makefile->IssueMessage(MessageType::AUTHOR_WARNING,
                                 "You have used file(GET_RUNTIME_DEPENDENCIES)"
                                 " in project mode. This is probably not what "
                                 "you intended to do. Instead, please consider"
                                 " using it in an install(CODE) or "
                                 "install(SCRIPT) command. For example:"
                                 "\n  install(CODE [["
                                 "\n    file(GET_RUNTIME_DEPENDENCIES"
                                 "\n      # ..."
                                 "\n      )"
                                 "\n    ]])");
  }

  struct Arguments
  {
    std::string ResolvedDependenciesVar;
    std::string UnresolvedDependenciesVar;
    std::string ConflictingDependenciesPrefix;
    std::string BundleExecutable;
    std::vector<std::string> Executables;
    std::vector<std::string> Libraries;
    std::vector<std::string> Directories;
    std::vector<std::string> Modules;
    std::vector<std::string> PreIncludeRegexes;
    std::vector<std::string> PreExcludeRegexes;
    std::vector<std::string> PostIncludeRegexes;
    std::vector<std::string> PostExcludeRegexes;
  };

  static auto const parser =
    cmArgumentParser<Arguments>{}
      .Bind("RESOLVED_DEPENDENCIES_VAR"_s, &Arguments::ResolvedDependenciesVar)
      .Bind("UNRESOLVED_DEPENDENCIES_VAR"_s,
            &Arguments::UnresolvedDependenciesVar)
      .Bind("CONFLICTING_DEPENDENCIES_PREFIX"_s,
            &Arguments::ConflictingDependenciesPrefix)
      .Bind("BUNDLE_EXECUTABLE"_s, &Arguments::BundleExecutable)
      .Bind("EXECUTABLES"_s, &Arguments::Executables)
      .Bind("LIBRARIES"_s, &Arguments::Libraries)
      .Bind("MODULES"_s, &Arguments::Modules)
      .Bind("DIRECTORIES"_s, &Arguments::Directories)
      .Bind("PRE_INCLUDE_REGEXES"_s, &Arguments::PreIncludeRegexes)
      .Bind("PRE_EXCLUDE_REGEXES"_s, &Arguments::PreExcludeRegexes)
      .Bind("POST_INCLUDE_REGEXES"_s, &Arguments::PostIncludeRegexes)
      .Bind("POST_EXCLUDE_REGEXES"_s, &Arguments::PostExcludeRegexes);

  std::vector<std::string> unrecognizedArguments;
  std::vector<std::string> keywordsMissingValues;
  auto parsedArgs =
    parser.Parse(cmMakeRange(args).advance(1), &unrecognizedArguments,
                 &keywordsMissingValues);
  auto argIt = unrecognizedArguments.begin();
  if (argIt != unrecognizedArguments.end()) {
    std::ostringstream e;
    e << "Unrecognized argument: \"" << *argIt << "\"";
    this->SetError(e.str());
    cmSystemTools::SetFatalErrorOccured();
    return false;
  }
  argIt = keywordsMissingValues.begin();
  if (argIt != keywordsMissingValues.end()) {
    std::ostringstream e;
    e << "Keyword missing value: " << *argIt;
    this->SetError(e.str());
    cmSystemTools::SetFatalErrorOccured();
    return false;
  }

  cmRuntimeDependencyArchive archive(
    this, parsedArgs.Directories, parsedArgs.BundleExecutable,
    parsedArgs.PreIncludeRegexes, parsedArgs.PreExcludeRegexes,
    parsedArgs.PostIncludeRegexes, parsedArgs.PostExcludeRegexes);
  if (!archive.Prepare()) {
    cmSystemTools::SetFatalErrorOccured();
    return false;
  }

  if (!archive.GetRuntimeDependencies(
        parsedArgs.Executables, parsedArgs.Libraries, parsedArgs.Modules)) {
    cmSystemTools::SetFatalErrorOccured();
    return false;
  }

  std::vector<std::string> deps, unresolvedDeps, conflictingDeps;
  for (auto const& val : archive.GetResolvedPaths()) {
    bool unique = true;
    auto it = val.second.begin();
    assert(it != val.second.end());
    auto const& firstPath = *it;
    while (++it != val.second.end()) {
      if (!cmSystemTools::SameFile(firstPath, *it)) {
        unique = false;
        break;
      }
    }

    if (unique) {
      deps.push_back(firstPath);
    } else if (!parsedArgs.ConflictingDependenciesPrefix.empty()) {
      conflictingDeps.push_back(val.first);
      std::vector<std::string> paths;
      paths.insert(paths.begin(), val.second.begin(), val.second.end());
      std::string varName =
        parsedArgs.ConflictingDependenciesPrefix + "_" + val.first;
      std::string pathsStr = cmJoin(paths, ";");
      this->Makefile->AddDefinition(varName, pathsStr.c_str());
    } else {
      std::ostringstream e;
      e << "Multiple conflicting paths found for " << val.first << ":";
      for (auto const& path : val.second) {
        e << "\n  " << path;
      }
      this->SetError(e.str());
      cmSystemTools::SetFatalErrorOccured();
      return false;
    }
  }
  if (!archive.GetUnresolvedPaths().empty()) {
    if (!parsedArgs.UnresolvedDependenciesVar.empty()) {
      unresolvedDeps.insert(unresolvedDeps.begin(),
                            archive.GetUnresolvedPaths().begin(),
                            archive.GetUnresolvedPaths().end());
    } else {
      auto it = archive.GetUnresolvedPaths().begin();
      assert(it != archive.GetUnresolvedPaths().end());
      std::ostringstream e;
      e << "Could not resolve file " << *it;
      this->SetError(e.str());
      cmSystemTools::SetFatalErrorOccured();
      return false;
    }
  }

  if (!parsedArgs.ResolvedDependenciesVar.empty()) {
    std::string val = cmJoin(deps, ";");
    this->Makefile->AddDefinition(parsedArgs.ResolvedDependenciesVar,
                                  val.c_str());
  }
  if (!parsedArgs.UnresolvedDependenciesVar.empty()) {
    std::string val = cmJoin(unresolvedDeps, ";");
    this->Makefile->AddDefinition(parsedArgs.UnresolvedDependenciesVar,
                                  val.c_str());
  }
  if (!parsedArgs.ConflictingDependenciesPrefix.empty()) {
    std::string val = cmJoin(conflictingDeps, ";");
    this->Makefile->AddDefinition(
      parsedArgs.ConflictingDependenciesPrefix + "_FILENAMES", val.c_str());
  }
  return true;
}